

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O3

int32 ngram_model_set_raw_score
                (ngram_model_t *base,int32 wid,int32 *history,int32 n_hist,int32 *n_used)

{
  int iVar1;
  logmath_t *plVar2;
  int logb_x;
  int32 iVar3;
  long lVar4;
  int32 *piVar5;
  ulong uVar6;
  int32 iVar7;
  uint n_hist_00;
  
  n_hist_00 = base->n - 1;
  if (n_hist < (int)(uint)base->n) {
    n_hist_00 = n_hist;
  }
  lVar4 = (long)*(int *)&base[1].field_0x4;
  if (lVar4 == -1) {
    logb_x = base->log_zero;
    if (0 < base[1].refcount) {
      lVar4 = 0;
      do {
        plVar2 = base[1].lmath;
        iVar3 = *(int32 *)((long)(&(plVar2->t).table)[wid] + lVar4 * 4);
        if ((int)n_hist_00 < 1) {
          piVar5 = *(int32 **)&base[1].lw;
        }
        else {
          piVar5 = *(int32 **)&base[1].lw;
          uVar6 = 0;
          do {
            if ((long)history[uVar6] == -1) {
              iVar7 = -1;
            }
            else {
              iVar7 = *(int32 *)((long)(&(plVar2->t).table)[history[uVar6]] + lVar4 * 4);
            }
            piVar5[uVar6] = iVar7;
            uVar6 = uVar6 + 1;
          } while (n_hist_00 != uVar6);
        }
        iVar1 = *(int *)(*(long *)&base[1].n + lVar4 * 4);
        plVar2 = base->lmath;
        iVar3 = ngram_ng_prob(*(ngram_model_t **)(base[1].n_counts + lVar4 * 2),iVar3,piVar5,
                              n_hist_00,n_used);
        logb_x = logmath_add(plVar2,logb_x,iVar1 + iVar3);
        lVar4 = lVar4 + 1;
      } while (lVar4 < base[1].refcount);
    }
    return logb_x;
  }
  plVar2 = base[1].lmath;
  iVar3 = *(int32 *)((long)(&(plVar2->t).table)[wid] + lVar4 * 4);
  if ((int)n_hist_00 < 1) {
    piVar5 = *(int32 **)&base[1].lw;
  }
  else {
    piVar5 = *(int32 **)&base[1].lw;
    uVar6 = 0;
    do {
      if ((long)history[uVar6] == -1) {
        iVar7 = -1;
      }
      else {
        iVar7 = *(int32 *)((long)(&(plVar2->t).table)[history[uVar6]] +
                          (long)*(int *)&base[1].field_0x4 * 4);
      }
      piVar5[uVar6] = iVar7;
      uVar6 = uVar6 + 1;
    } while (n_hist_00 != uVar6);
    lVar4 = (long)*(int *)&base[1].field_0x4;
  }
  iVar3 = ngram_ng_prob(*(ngram_model_t **)(base[1].n_counts + lVar4 * 2),iVar3,piVar5,n_hist_00,
                        n_used);
  return iVar3;
}

Assistant:

static int32
ngram_model_set_raw_score(ngram_model_t * base, int32 wid,
                          int32 * history, int32 n_hist, int32 * n_used)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 mapwid;
    int32 score;
    int32 i;

    /* Truncate the history. */
    if (n_hist > base->n - 1)
        n_hist = base->n - 1;

    /* Interpolate if there is no current. */
    if (set->cur == -1) {
        score = base->log_zero;
        for (i = 0; i < set->n_models; ++i) {
            int32 j;
            /* Map word and history IDs for each model. */
            mapwid = set->widmap[wid][i];
            for (j = 0; j < n_hist; ++j) {
                if (history[j] == NGRAM_INVALID_WID)
                    set->maphist[j] = NGRAM_INVALID_WID;
                else
                    set->maphist[j] = set->widmap[history[j]][i];
            }
            score = logmath_add(base->lmath, score,
                                set->lweights[i] +
                                ngram_ng_prob(set->lms[i],
                                              mapwid, set->maphist, n_hist,
                                              n_used));
        }
    }
    else {
        int32 j;
        /* Map word and history IDs (FIXME: do this in a function?) */
        mapwid = set->widmap[wid][set->cur];
        for (j = 0; j < n_hist; ++j) {
            if (history[j] == NGRAM_INVALID_WID)
                set->maphist[j] = NGRAM_INVALID_WID;
            else
                set->maphist[j] = set->widmap[history[j]][set->cur];
        }
        score = ngram_ng_prob(set->lms[set->cur],
                              mapwid, set->maphist, n_hist, n_used);
    }

    return score;
}